

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::SegmentInfo::Init(SegmentInfo *this)

{
  size_t __n;
  char *__dest;
  bool bVar1;
  int32_t revision;
  int32_t build;
  int32_t minor;
  int32_t major;
  char temp [256];
  int32 local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  char local_128 [256];
  
  GetVersion((int32 *)&local_12c,(int32 *)&local_130,(int32 *)&local_134,&local_138);
  snprintf(local_128,0x100,"libwebm-%d.%d.%d.%d",(ulong)local_12c,(ulong)local_130,(ulong)local_134,
           local_138);
  __n = strlen(local_128);
  if (this->muxing_app_ != (char *)0x0) {
    operator_delete__(this->muxing_app_);
  }
  __dest = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
  this->muxing_app_ = __dest;
  if (__dest == (char *)0x0) {
    bVar1 = false;
  }
  else {
    memcpy(__dest,local_128,__n);
    __dest[__n] = '\0';
    set_writing_app(this,local_128);
    bVar1 = this->writing_app_ != (char *)0x0;
  }
  return bVar1;
}

Assistant:

bool SegmentInfo::Init() {
  int32_t major;
  int32_t minor;
  int32_t build;
  int32_t revision;
  GetVersion(&major, &minor, &build, &revision);
  char temp[256];
#ifdef _MSC_VER
  sprintf_s(temp, sizeof(temp) / sizeof(temp[0]), "libwebm-%d.%d.%d.%d", major,
            minor, build, revision);
#else
  snprintf(temp, sizeof(temp) / sizeof(temp[0]), "libwebm-%d.%d.%d.%d", major,
           minor, build, revision);
#endif

  const size_t app_len = strlen(temp) + 1;

  delete[] muxing_app_;

  muxing_app_ = new (std::nothrow) char[app_len];  // NOLINT
  if (!muxing_app_)
    return false;

  memcpy(muxing_app_, temp, app_len - 1);
  muxing_app_[app_len - 1] = '\0';

  set_writing_app(temp);
  if (!writing_app_)
    return false;
  return true;
}